

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileParser.cpp
# Opt level: O1

void __thiscall
Assimp::ObjFileParser::getVector2
          (ObjFileParser *this,
          vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *point2d_array)

{
  char *this_00;
  byte *pbVar1;
  byte *pbVar2;
  float fVar3;
  byte *pbVar4;
  undefined1 in_CL;
  ai_real ret;
  aiVector2t<float> local_30;
  
  this_00 = this->m_buffer;
  copyNextWord(this,this_00,0x1000);
  local_30.x = 0.0;
  fast_atoreal_move<float>((Assimp *)this_00,(char *)&local_30,(float *)0x1,(bool)in_CL);
  fVar3 = local_30.x;
  copyNextWord(this,this_00,0x1000);
  local_30.x = 0.0;
  fast_atoreal_move<float>((Assimp *)this_00,(char *)&local_30,(float *)0x1,(bool)in_CL);
  local_30.y = local_30.x;
  local_30.x = fVar3;
  std::vector<aiVector2t<float>,std::allocator<aiVector2t<float>>>::emplace_back<aiVector2t<float>>
            ((vector<aiVector2t<float>,std::allocator<aiVector2t<float>>> *)point2d_array,&local_30)
  ;
  pbVar4 = (byte *)(this->m_DataIt)._M_current;
  pbVar1 = (byte *)(this->m_DataItEnd)._M_current;
  if (pbVar1 + -1 != pbVar4 && pbVar4 != pbVar1) {
    do {
      if (((*pbVar4 < 0xe) && ((0x3401U >> (*pbVar4 & 0x1f) & 1) != 0)) ||
         (pbVar4 = pbVar4 + 1, pbVar4 == pbVar1)) break;
    } while (pbVar4 != pbVar1 + -1);
  }
  pbVar2 = pbVar4;
  if (pbVar4 != pbVar1) {
    pbVar4 = pbVar4 + 1;
    this->m_uiLine = this->m_uiLine + 1;
    pbVar2 = pbVar4;
  }
  for (; (pbVar2 != pbVar1 && ((*pbVar2 == 0x20 || (pbVar4 = pbVar2, *pbVar2 == 9))));
      pbVar2 = pbVar2 + 1) {
    pbVar4 = pbVar1;
  }
  (this->m_DataIt)._M_current = (char *)pbVar4;
  return;
}

Assistant:

void ObjFileParser::getVector2( std::vector<aiVector2D> &point2d_array ) {
    ai_real x, y;
    copyNextWord(m_buffer, Buffersize);
    x = (ai_real) fast_atof(m_buffer);

    copyNextWord(m_buffer, Buffersize);
    y = (ai_real) fast_atof(m_buffer);

    point2d_array.push_back(aiVector2D(x, y));

    m_DataIt = skipLine<DataArrayIt>( m_DataIt, m_DataItEnd, m_uiLine );
}